

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

char * llb_buildsystem_command_get_verbose_description(llb_buildsystem_command_t *command_p)

{
  char *pcVar1;
  SmallString<256U> result;
  SmallString<256U> local_120;
  
  local_120.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &local_120.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  local_120.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_120.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  (**(code **)(*(long *)command_p + 0x20))(command_p,&local_120);
  pcVar1 = llvm::SmallString<256U>::c_str(&local_120);
  pcVar1 = strdup(pcVar1);
  llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&local_120);
  return pcVar1;
}

Assistant:

char* llb_buildsystem_command_get_verbose_description(
    llb_buildsystem_command_t* command_p) {
  auto command = (Command*) command_p;

  SmallString<256> result;
  command->getVerboseDescription(result);
  return strdup(result.c_str());
}